

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::AltNode::Emit(AltNode *this,Compiler *compiler,CharCount *skipped)

{
  RuntimeCharTrie *pRVar1;
  code *pcVar2;
  undefined4 uVar3;
  CharCount *pCVar4;
  bool bVar5;
  char16 cVar6;
  uint uVar7;
  Label label;
  Label LVar8;
  uint uVar9;
  Label LVar10;
  ThreadContext *this_00;
  undefined4 *puVar11;
  TryMatchCharInst *this_01;
  TryMatchSetInst *this_02;
  TryIfCharInst *this_03;
  TryIfSetInst *this_04;
  TryInst *this_05;
  MatchTrieInst *this_06;
  ulong uVar12;
  SwitchAndConsume2Inst *pSVar13;
  SwitchAndConsume4Inst *pSVar14;
  SwitchAndConsume8Inst *pSVar15;
  SwitchAndConsume16Inst *pSVar16;
  SwitchAndConsume24Inst *pSVar17;
  Switch2Inst *pSVar18;
  Switch4Inst *pSVar19;
  Switch8Inst *pSVar20;
  Switch16Inst *pSVar21;
  Switch24Inst *pSVar22;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar23;
  MatchCharOrJumpInst *this_07;
  JumpIfNotCharInst *this_08;
  MatchSetOrJumpInst *this_09;
  JumpIfNotSetInst *this_10;
  JumpInst *pJVar24;
  OptMatchCharInst *this_11;
  OptMatchSetInst *this_12;
  MatchCharInst *this_13;
  MatchSetInst<false> *this_14;
  JumpIfNotSetInst *i_4;
  MatchSetOrJumpInst *i_3;
  AltNode *pAStack_1b8;
  CharCount itemSkipped_1;
  AltNode *curr_6;
  int item_2;
  Label lastJumpFixup;
  undefined8 local_1a0;
  TrackAllocData local_198;
  uint *local_170;
  Label *jumpFixups_2;
  AltNode *curr_5;
  int local_158;
  int numItems_2;
  int i_2;
  int count;
  Char entries [4];
  AltNode *curr_4;
  AltNode *curr_3;
  Label local_130;
  int item_1;
  Label defaultJumpFixup;
  Label switchLabel;
  TrackAllocData local_118;
  uint *local_f0;
  Label *caseLabels;
  undefined8 local_e0;
  TrackAllocData local_d8;
  uint *local_b0;
  Label *jumpFixups_1;
  AltNode *curr_2;
  bool allCanSkip;
  TryIfSetInst *pTStack_98;
  int numItems_1;
  TryIfSetInst *i_1;
  TryMatchSetInst *i;
  AltNode *pAStack_80;
  CharCount itemSkipped;
  AltNode *curr_1;
  int item;
  Label lastTryFixup;
  undefined8 local_68;
  TrackAllocData local_60;
  uint *local_38;
  Label *jumpFixups;
  AltNode *curr;
  CharCount *pCStack_20;
  int numItems;
  CharCount *skipped_local;
  Compiler *compiler_local;
  AltNode *this_local;
  
  pCStack_20 = skipped;
  skipped_local = (CharCount *)compiler;
  compiler_local = (Compiler *)this;
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,*(ScriptContext **)skipped_local,(PVOID)0x0);
  if (*pCStack_20 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xa42,"(skipped == 0)","skipped == 0");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  switch(this->scheme) {
  case Try:
    if ((this->isOptional & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa53,"(!isOptional)","!isOptional");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    curr._4_4_ = 0;
    for (jumpFixups = (Label *)this; jumpFixups != (Label *)0x0;
        jumpFixups = *(Label **)(jumpFixups + 0x10)) {
      curr._4_4_ = curr._4_4_ + 1;
    }
    if (curr._4_4_ < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa57,"(numItems >= 1)","numItems >= 1");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pAVar23 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               (skipped_local + 2);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&unsigned_int::typeinfo,0,(long)(curr._4_4_ + -1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0xa59);
    pAVar23 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar23,&local_60);
    _item = Memory::ArenaAllocator::Alloc;
    local_68 = 0;
    local_38 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)pAVar23,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                          (long)(curr._4_4_ + -1));
    curr_1._4_4_ = 0;
    curr_1._0_4_ = 0;
    for (pAStack_80 = this; pCVar4 = skipped_local, LVar10 = curr_1._4_4_,
        pAStack_80 != (AltNode *)0x0; pAStack_80 = pAStack_80->tail) {
      if (0 < (int)curr_1) {
        LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
        Compiler::DoFixup((Compiler *)pCVar4,LVar10,LVar8);
      }
      i._4_4_ = 0;
      if ((int)curr_1 < curr._4_4_ + -1) {
        if (((pAStack_80->head->firstSet == (CharSet<char16_t> *)0x0) ||
            (bVar5 = CountDomain::CouldMatchEmpty(&pAStack_80->head->thisConsumes), bVar5)) ||
           (((*(uint *)&pAStack_80->head->field_0xc & 1) == 0 &&
            (uVar7 = CharSet<char16_t>::Count(pAStack_80->head->firstSet), 0x14 < uVar7)))) {
          pCVar4 = skipped_local;
          this_05 = (TryInst *)Compiler::Emit((Compiler *)skipped_local,5);
          TryInst::TryInst(this_05);
          curr_1._4_4_ = Compiler::GetFixup((Compiler *)pCVar4,&(this_05->super_TryMixin).failLabel)
          ;
        }
        else {
          uVar9 = (*pAStack_80->head->_vptr_Node[0xb])(pAStack_80->head,skipped_local);
          if ((uVar9 & 1) == 0) {
            bVar5 = CharSet<char16_t>::IsSingleton(pAStack_80->head->firstSet);
            pCVar4 = skipped_local;
            if (bVar5) {
              this_03 = (TryIfCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
              cVar6 = CharSet<char16_t>::Singleton(pAStack_80->head->firstSet);
              TryIfCharInst::TryIfCharInst(this_03,cVar6);
              curr_1._4_4_ = Compiler::GetFixup((Compiler *)pCVar4,
                                                &(this_03->super_TryMixin).failLabel);
            }
            else {
              this_04 = (TryIfSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
              TryIfSetInst::TryIfSetInst(this_04);
              pTStack_98 = this_04;
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_04->super_SetMixin<false>).set,
                         *(ArenaAllocator **)(skipped_local + 4),pAStack_80->head->firstSet);
              curr_1._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                                &(pTStack_98->super_TryMixin).failLabel);
            }
          }
          else {
            bVar5 = CharSet<char16_t>::IsSingleton(pAStack_80->head->firstSet);
            pCVar4 = skipped_local;
            if (bVar5) {
              this_01 = (TryMatchCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
              cVar6 = CharSet<char16_t>::Singleton(pAStack_80->head->firstSet);
              TryMatchCharInst::TryMatchCharInst(this_01,cVar6);
              curr_1._4_4_ = Compiler::GetFixup((Compiler *)pCVar4,
                                                &(this_01->super_TryMixin).failLabel);
            }
            else {
              this_02 = (TryMatchSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
              TryMatchSetInst::TryMatchSetInst(this_02);
              i_1 = (TryIfSetInst *)this_02;
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_02->super_SetMixin<false>).set,
                         *(ArenaAllocator **)(skipped_local + 4),pAStack_80->head->firstSet);
              curr_1._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                                &(i_1->super_TryMixin).failLabel);
            }
            i._4_4_ = 1;
          }
        }
      }
      (*pAStack_80->head->_vptr_Node[0x11])(pAStack_80->head,skipped_local,(long)&i + 4);
      pCVar4 = skipped_local;
      if ((int)curr_1 < curr._4_4_ + -1) {
        pJVar24 = (JumpInst *)Compiler::Emit((Compiler *)skipped_local,5);
        JumpInst::JumpInst(pJVar24);
        LVar10 = Compiler::GetFixup((Compiler *)pCVar4,&(pJVar24->super_JumpMixin).targetLabel);
        local_38[(int)curr_1] = LVar10;
      }
      curr_1._0_4_ = (int)curr_1 + 1;
    }
    for (curr_1._0_4_ = 0; pCVar4 = skipped_local, (int)curr_1 < curr._4_4_ + -1;
        curr_1._0_4_ = (int)curr_1 + 1) {
      LVar10 = local_38[(int)curr_1];
      LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
      Compiler::DoFixup((Compiler *)pCVar4,LVar10,LVar8);
    }
    break;
  case None:
    if ((this->isOptional & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa91,"(isOptional)","isOptional");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case Trie:
    pRVar1 = this->runtimeTrie;
    this_06 = (MatchTrieInst *)Compiler::Emit((Compiler *)skipped_local,0x11);
    MatchTrieInst::MatchTrieInst(this_06);
    uVar3 = *(undefined4 *)&pRVar1->field_0x4;
    (this_06->super_TrieMixin).trie.count = pRVar1->count;
    *(undefined4 *)&(this_06->super_TrieMixin).trie.field_0x4 = uVar3;
    (this_06->super_TrieMixin).trie.children = pRVar1->children;
    break;
  case Switch:
    if (0x18 < this->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xaae,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    curr_2._4_4_ = 0;
    curr_2._3_1_ = 1;
    for (jumpFixups_1 = (Label *)this; jumpFixups_1 != (Label *)0x0;
        jumpFixups_1 = *(Label **)(jumpFixups_1 + 0x10)) {
      bVar5 = CountDomain::CouldMatchEmpty((CountDomain *)(*(long *)(jumpFixups_1 + 0xe) + 0x28));
      if (bVar5) {
        if ((this->isOptional & 1U) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xab5,"(isOptional)","isOptional");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      else {
        curr_2._4_4_ = curr_2._4_4_ + 1;
        uVar12 = (**(code **)(**(long **)(jumpFixups_1 + 0xe) + 0x58))
                           (*(long **)(jumpFixups_1 + 0xe),skipped_local);
        if ((uVar12 & 1) == 0) {
          curr_2._3_1_ = 0;
        }
      }
    }
    if (curr_2._4_4_ < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac0,"(numItems > 1)","numItems > 1");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pAVar23 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               (skipped_local + 2);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d8,(type_info *)&unsigned_int::typeinfo,0,(long)(curr_2._4_4_ + -1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0xac3);
    pAVar23 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar23,&local_d8);
    caseLabels = (Label *)Memory::ArenaAllocator::Alloc;
    local_e0 = 0;
    local_b0 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)pAVar23,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                          (long)(curr_2._4_4_ + -1));
    pAVar23 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               (skipped_local + 2);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_118,(type_info *)&unsigned_int::typeinfo,0,(long)curr_2._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0xac5);
    pAVar23 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar23,&local_118);
    local_f0 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)pAVar23,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                          (long)curr_2._4_4_);
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    if (0x18 < this->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac9,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((curr_2._3_1_ & 1) == 0) {
      if (this->switchSize < 3) {
        pSVar18 = (Switch2Inst *)Compiler::Emit((Compiler *)skipped_local,0xe);
        Switch2Inst::Switch2Inst(pSVar18);
      }
      else if (this->switchSize < 5) {
        pSVar19 = (Switch4Inst *)Compiler::Emit((Compiler *)skipped_local,0x1a);
        Switch4Inst::Switch4Inst(pSVar19);
      }
      else if (this->switchSize < 9) {
        pSVar20 = (Switch8Inst *)Compiler::Emit((Compiler *)skipped_local,0x32);
        Switch8Inst::Switch8Inst(pSVar20);
      }
      else if (this->switchSize < 0x11) {
        pSVar21 = (Switch16Inst *)Compiler::Emit((Compiler *)skipped_local,0x62);
        Switch16Inst::Switch16Inst(pSVar21);
      }
      else if (this->switchSize < 0x19) {
        pSVar22 = (Switch24Inst *)Compiler::Emit((Compiler *)skipped_local,0x92);
        Switch24Inst::Switch24Inst(pSVar22);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0xafd,"(false)",
                           "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases."
                          );
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    else if (this->switchSize < 3) {
      pSVar13 = (SwitchAndConsume2Inst *)Compiler::Emit((Compiler *)skipped_local,0xe);
      SwitchAndConsume2Inst::SwitchAndConsume2Inst(pSVar13);
    }
    else if (this->switchSize < 5) {
      pSVar14 = (SwitchAndConsume4Inst *)Compiler::Emit((Compiler *)skipped_local,0x1a);
      SwitchAndConsume4Inst::SwitchAndConsume4Inst(pSVar14);
    }
    else if (this->switchSize < 9) {
      pSVar15 = (SwitchAndConsume8Inst *)Compiler::Emit((Compiler *)skipped_local,0x32);
      SwitchAndConsume8Inst::SwitchAndConsume8Inst(pSVar15);
    }
    else if (this->switchSize < 0x11) {
      pSVar16 = (SwitchAndConsume16Inst *)Compiler::Emit((Compiler *)skipped_local,0x62);
      SwitchAndConsume16Inst::SwitchAndConsume16Inst(pSVar16);
    }
    else if (this->switchSize < 0x19) {
      pSVar17 = (SwitchAndConsume24Inst *)Compiler::Emit((Compiler *)skipped_local,0x92);
      SwitchAndConsume24Inst::SwitchAndConsume24Inst(pSVar17);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xae2,"(false)",
                         "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases."
                        );
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pCVar4 = skipped_local;
    local_130 = 0;
    if ((this->isOptional & 1U) == 0) {
      Compiler::Emit<UnifiedRegex::FailInst>((Compiler *)skipped_local);
    }
    else {
      pJVar24 = (JumpInst *)Compiler::Emit((Compiler *)skipped_local,5);
      JumpInst::JumpInst(pJVar24);
      local_130 = Compiler::GetFixup((Compiler *)pCVar4,&(pJVar24->super_JumpMixin).targetLabel);
    }
    curr_3._4_4_ = 0;
    for (curr_4 = this; pCVar4 = skipped_local, curr_4 != (AltNode *)0x0; curr_4 = curr_4->tail) {
      bVar5 = CountDomain::CouldMatchEmpty(&curr_4->head->thisConsumes);
      if (!bVar5) {
        if ((curr_2._3_1_ & 1) != 0) {
          *pCStack_20 = 1;
        }
        LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
        local_f0[curr_3._4_4_] = LVar8;
        (*curr_4->head->_vptr_Node[0x11])(curr_4->head,skipped_local,pCStack_20);
        pCVar4 = skipped_local;
        if (curr_3._4_4_ < curr_2._4_4_ + -1) {
          pJVar24 = (JumpInst *)Compiler::Emit((Compiler *)skipped_local,5);
          JumpInst::JumpInst(pJVar24);
          LVar8 = Compiler::GetFixup((Compiler *)pCVar4,&(pJVar24->super_JumpMixin).targetLabel);
          local_b0[curr_3._4_4_] = LVar8;
        }
        curr_3._4_4_ = curr_3._4_4_ + 1;
      }
    }
    if ((this->isOptional & 1U) != 0) {
      LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
      Compiler::DoFixup((Compiler *)pCVar4,local_130,LVar8);
    }
    for (curr_3._4_4_ = 0; pCVar4 = skipped_local, curr_3._4_4_ < curr_2._4_4_ + -1;
        curr_3._4_4_ = curr_3._4_4_ + 1) {
      LVar8 = local_b0[curr_3._4_4_];
      label = Compiler::CurrentLabel((Compiler *)skipped_local);
      Compiler::DoFixup((Compiler *)pCVar4,LVar8,label);
    }
    curr_3._4_4_ = 0;
    for (entries = (Char  [4])this; entries != (Char  [4])0x0;
        entries = *(Char (*) [4])((long)entries + 0x40)) {
      bVar5 = CountDomain::CouldMatchEmpty((CountDomain *)(*(long *)((long)entries + 0x38) + 0x28));
      if (!bVar5) {
        numItems_2 = CharSet<char16_t>::GetCompactEntries
                               (*(CharSet<char16_t> **)(*(long *)((long)entries + 0x38) + 0x10),4,
                                (Char *)&i_2);
        if (numItems_2 < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb33,"(count > 0)","count > 0");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        for (local_158 = 0; local_158 < numItems_2; local_158 = local_158 + 1) {
          if ((curr_2._3_1_ & 1) == 0) {
            if (this->switchSize < 3) {
              pSVar18 = Compiler::LabelToInstPointer<UnifiedRegex::Switch2Inst>
                                  ((Compiler *)skipped_local,Switch2,LVar10);
              SwitchMixin<(unsigned_char)'\x02'>::AddCase
                        (&pSVar18->super_SwitchMixin<(unsigned_char)__x02_>,
                         *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
            }
            else if (this->switchSize < 5) {
              pSVar19 = Compiler::LabelToInstPointer<UnifiedRegex::Switch4Inst>
                                  ((Compiler *)skipped_local,Switch4,LVar10);
              SwitchMixin<(unsigned_char)'\x04'>::AddCase
                        (&pSVar19->super_SwitchMixin<(unsigned_char)__x04_>,
                         *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
            }
            else if (this->switchSize < 9) {
              pSVar20 = Compiler::LabelToInstPointer<UnifiedRegex::Switch8Inst>
                                  ((Compiler *)skipped_local,Switch8,LVar10);
              SwitchMixin<(unsigned_char)'\b'>::AddCase
                        (&pSVar20->super_SwitchMixin<(unsigned_char)__b_>,
                         *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
            }
            else if (this->switchSize < 0x11) {
              pSVar21 = Compiler::LabelToInstPointer<UnifiedRegex::Switch16Inst>
                                  ((Compiler *)skipped_local,Switch16,LVar10);
              SwitchMixin<(unsigned_char)'\x10'>::AddCase
                        (&pSVar21->super_SwitchMixin<(unsigned_char)__x10_>,
                         *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
            }
            else if (this->switchSize < 0x19) {
              pSVar22 = Compiler::LabelToInstPointer<UnifiedRegex::Switch24Inst>
                                  ((Compiler *)skipped_local,Switch24,LVar10);
              SwitchMixin<(unsigned_char)'\x18'>::AddCase
                        (&pSVar22->super_SwitchMixin<(unsigned_char)__x18_>,
                         *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
            }
          }
          else if (this->switchSize < 3) {
            pSVar13 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume2Inst>
                                ((Compiler *)skipped_local,SwitchAndConsume2,LVar10);
            SwitchMixin<(unsigned_char)'\x02'>::AddCase
                      (&pSVar13->super_SwitchMixin<(unsigned_char)__x02_>,
                       *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
          }
          else if (this->switchSize < 5) {
            pSVar14 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume4Inst>
                                ((Compiler *)skipped_local,SwitchAndConsume4,LVar10);
            SwitchMixin<(unsigned_char)'\x04'>::AddCase
                      (&pSVar14->super_SwitchMixin<(unsigned_char)__x04_>,
                       *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
          }
          else if (this->switchSize < 9) {
            pSVar15 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume8Inst>
                                ((Compiler *)skipped_local,SwitchAndConsume8,LVar10);
            SwitchMixin<(unsigned_char)'\b'>::AddCase
                      (&pSVar15->super_SwitchMixin<(unsigned_char)__b_>,
                       *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
          }
          else if (this->switchSize < 0x11) {
            pSVar16 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume16Inst>
                                ((Compiler *)skipped_local,SwitchAndConsume16,LVar10);
            SwitchMixin<(unsigned_char)'\x10'>::AddCase
                      (&pSVar16->super_SwitchMixin<(unsigned_char)__x10_>,
                       *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
          }
          else if (this->switchSize < 0x19) {
            pSVar17 = Compiler::LabelToInstPointer<UnifiedRegex::SwitchAndConsume24Inst>
                                ((Compiler *)skipped_local,SwitchAndConsume24,LVar10);
            SwitchMixin<(unsigned_char)'\x18'>::AddCase
                      (&pSVar17->super_SwitchMixin<(unsigned_char)__x18_>,
                       *(char16 *)((long)&i_2 + (long)local_158 * 2),local_f0[curr_3._4_4_]);
          }
        }
        curr_3._4_4_ = curr_3._4_4_ + 1;
      }
    }
    break;
  case Chain:
    curr_5._4_4_ = 0;
    for (jumpFixups_2 = (Label *)this; jumpFixups_2 != (Label *)0x0;
        jumpFixups_2 = *(Label **)(jumpFixups_2 + 0x10)) {
      bVar5 = CountDomain::CouldMatchEmpty((CountDomain *)(*(long *)(jumpFixups_2 + 0xe) + 0x28));
      if (bVar5) {
        if ((this->isOptional & 1U) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb7f,"(isOptional)","isOptional");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      else {
        curr_5._4_4_ = curr_5._4_4_ + 1;
      }
    }
    if (curr_5._4_4_ < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xb84,"(numItems > 0)","numItems > 0");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pAVar23 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               (skipped_local + 2);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_198,(type_info *)&unsigned_int::typeinfo,0,(long)(curr_5._4_4_ + -1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0xb86);
    pAVar23 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar23,&local_198);
    _item_2 = Memory::ArenaAllocator::Alloc;
    local_1a0 = 0;
    local_170 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                          ((Memory *)pAVar23,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                           (long)(curr_5._4_4_ + -1));
    curr_6._4_4_ = 0;
    curr_6._0_4_ = 0;
    for (pAStack_1b8 = this; pAStack_1b8 != (AltNode *)0x0; pAStack_1b8 = pAStack_1b8->tail) {
      bVar5 = CountDomain::CouldMatchEmpty(&pAStack_1b8->head->thisConsumes);
      pCVar4 = skipped_local;
      LVar10 = curr_6._4_4_;
      if (!bVar5) {
        if (0 < (int)curr_6) {
          LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
          Compiler::DoFixup((Compiler *)pCVar4,LVar10,LVar8);
        }
        i_3._4_4_ = 0;
        if (((int)curr_6 < curr_5._4_4_ + -1) || ((this->isOptional & 1U) != 0)) {
          bVar5 = CharSet<char16_t>::IsSingleton(pAStack_1b8->head->firstSet);
          if (bVar5) {
            uVar9 = (*pAStack_1b8->head->_vptr_Node[0xb])(pAStack_1b8->head,skipped_local);
            pCVar4 = skipped_local;
            if ((uVar9 & 1) == 0) {
              this_08 = (JumpIfNotCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
              cVar6 = CharSet<char16_t>::Singleton(pAStack_1b8->head->firstSet);
              JumpIfNotCharInst::JumpIfNotCharInst(this_08,cVar6);
              curr_6._4_4_ = Compiler::GetFixup((Compiler *)pCVar4,
                                                &(this_08->super_JumpMixin).targetLabel);
            }
            else {
              this_07 = (MatchCharOrJumpInst *)Compiler::Emit((Compiler *)skipped_local,7);
              cVar6 = CharSet<char16_t>::Singleton(pAStack_1b8->head->firstSet);
              MatchCharOrJumpInst::MatchCharOrJumpInst(this_07,cVar6);
              curr_6._4_4_ = Compiler::GetFixup((Compiler *)pCVar4,
                                                &(this_07->super_JumpMixin).targetLabel);
              i_3._4_4_ = 1;
            }
          }
          else {
            uVar9 = (*pAStack_1b8->head->_vptr_Node[0xb])(pAStack_1b8->head,skipped_local);
            if ((uVar9 & 1) == 0) {
              this_10 = (JumpIfNotSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
              JumpIfNotSetInst::JumpIfNotSetInst(this_10);
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_10->super_SetMixin<false>).set,
                         *(ArenaAllocator **)(skipped_local + 4),pAStack_1b8->head->firstSet);
              curr_6._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                                &(this_10->super_JumpMixin).targetLabel);
            }
            else {
              this_09 = (MatchSetOrJumpInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
              MatchSetOrJumpInst::MatchSetOrJumpInst(this_09);
              RuntimeCharSet<char16_t>::CloneFrom
                        (&(this_09->super_SetMixin<false>).set,
                         *(ArenaAllocator **)(skipped_local + 4),pAStack_1b8->head->firstSet);
              curr_6._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                                &(this_09->super_JumpMixin).targetLabel);
              i_3._4_4_ = 1;
            }
          }
        }
        (*pAStack_1b8->head->_vptr_Node[0x11])(pAStack_1b8->head,skipped_local,(long)&i_3 + 4);
        pCVar4 = skipped_local;
        if ((int)curr_6 < curr_5._4_4_ + -1) {
          pJVar24 = (JumpInst *)Compiler::Emit((Compiler *)skipped_local,5);
          JumpInst::JumpInst(pJVar24);
          LVar10 = Compiler::GetFixup((Compiler *)pCVar4,&(pJVar24->super_JumpMixin).targetLabel);
          local_170[(int)curr_6] = LVar10;
        }
        curr_6._0_4_ = (int)curr_6 + 1;
      }
    }
    for (curr_6._0_4_ = 0; pCVar4 = skipped_local, LVar10 = curr_6._4_4_,
        (int)curr_6 < curr_5._4_4_ + -1; curr_6._0_4_ = (int)curr_6 + 1) {
      LVar10 = local_170[(int)curr_6];
      LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
      Compiler::DoFixup((Compiler *)pCVar4,LVar10,LVar8);
    }
    if ((this->isOptional & 1U) != 0) {
      LVar8 = Compiler::CurrentLabel((Compiler *)skipped_local);
      Compiler::DoFixup((Compiler *)pCVar4,LVar10,LVar8);
    }
    break;
  case Set:
    if ((this->isOptional & 1U) == 0) {
      bVar5 = CharSet<char16_t>::IsSingleton((this->super_Node).firstSet);
      if (bVar5) {
        this_13 = (MatchCharInst *)Compiler::Emit((Compiler *)skipped_local,3);
        cVar6 = CharSet<char16_t>::Singleton((this->super_Node).firstSet);
        MatchCharInst::MatchCharInst(this_13,cVar6);
      }
      else {
        this_14 = (MatchSetInst<false> *)Compiler::Emit((Compiler *)skipped_local,0x29);
        MatchSetInst<false>::MatchSetInst(this_14);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_14->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   (this->super_Node).firstSet);
      }
    }
    else {
      bVar5 = CharSet<char16_t>::IsSingleton((this->super_Node).firstSet);
      if (bVar5) {
        this_11 = (OptMatchCharInst *)Compiler::Emit((Compiler *)skipped_local,3);
        cVar6 = CharSet<char16_t>::Singleton((this->super_Node).firstSet);
        OptMatchCharInst::OptMatchCharInst(this_11,cVar6);
      }
      else {
        this_12 = (OptMatchSetInst *)Compiler::Emit((Compiler *)skipped_local,0x29);
        OptMatchSetInst::OptMatchSetInst(this_12);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_12->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   (this->super_Node).firstSet);
      }
    }
  }
  return;
}

Assistant:

void AltNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);
        switch (scheme)
        {
            case Try:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Try((If|Match)(Char|Set))? L2
                    //          <item 1>
                    //          Jump Lexit
                    //   L2:    Try((If|Match)(Char|Set))? L3
                    //          <item 2>
                    //          Jump Lexit
                    //   L3:    <item 3>
                    //   Lexit:
                    //
                    Assert(!isOptional);
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                        numItems++;
                    Assert(numItems >= 1);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastTryFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail, item++)
                    {
                        if (item > 0)
                            // Fixup previous Try
                            compiler.DoFixup(lastTryFixup, compiler.CurrentLabel());
                        CharCount itemSkipped = 0;
                        if (item < numItems-1)
                        {
                            // HEURISTIC: if the first set of the alternative is exact or small, and the
                            //            alternative does not match empty, then it's probably worth using
                            //            a Try(If|Match)(Char|Set)
                            if (curr->head->firstSet != 0 &&
                                !curr->head->thisConsumes.CouldMatchEmpty() &&
                                (curr->head->isFirstExact || curr->head->firstSet->Count() <= maxCharsForConditionalTry))
                            {
                                if (curr->head->SupportsPrefixSkipping(compiler))
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                    itemSkipped = 1;
                                }
                                else
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                }
                            }
                            else
                                lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                        }
                        curr->head->Emit(compiler, itemSkipped);
                        if (item < numItems-1)
                            jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    // Fixup jumps
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    break;
                }
            case None:
                {
                    Assert(isOptional);
                    // Nothing to emit
                    break;
                }
            case Trie:
                {
                    //
                    // Compilation scheme:
                    //
                    //     MatchTrie <trie>
                    //
                    EMIT(compiler, MatchTrieInst)->trie = *runtimeTrie;
                    break;
                }
            case Switch:
                {
                    //
                    // Compilation scheme:
                    //
                    //            Switch(AndConsume)?(2|4|8|16|24)(<dispatch to each arm>)
                    //            Fail                                (if non-optional)
                    //            Jump Lexit                          (if optional)
                    //     L1:    <item1>
                    //            Jump Lexit
                    //     L2:    <item2>
                    //            Jump Lexit
                    //     L3:    <item3>
                    //     Lexit:
                    //
                    Assert(switchSize <= Switch24Inst::MaxCases);
                    int numItems = 0;
                    bool allCanSkip = true;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                        {
                            numItems++;
                            if (!curr->head->SupportsPrefixSkipping(compiler))
                            {
                                allCanSkip = false;
                            }
                        }
                    }
                    Assert(numItems > 1);

                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    // We must remember where each item begins to fixup switch
                    Label* caseLabels = AnewArray(compiler.ctAllocator, Label, numItems);
                    // We must fixup the switch arms
                    Label switchLabel = compiler.CurrentLabel();

                    Assert(switchSize <= Switch24Inst::MaxCases);
                    if (allCanSkip)
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }
                    else
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, Switch2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, Switch4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, Switch8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, Switch16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, Switch24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }

                    Label defaultJumpFixup = 0;
                    if (isOptional)
                    {
                        // Must fixup default jump to exit
                        defaultJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    else
                    {
                        compiler.Emit<FailInst>();
                    }

                    // Emit each item
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (allCanSkip)
                            {
                                skipped = 1;
                            }
                            caseLabels[item] = compiler.CurrentLabel();
                            curr->head->Emit(compiler, skipped);
                            if (item < numItems - 1)
                            {
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            }
                            item++;
                        }
                    }

                    // Fixup exit labels
                    if (isOptional)
                    {
                        compiler.DoFixup(defaultJumpFixup, compiler.CurrentLabel());
                    }

                    for (item = 0; item < numItems - 1; item++)
                    {
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    }

                    // Fixup the switch entries
                    item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Char entries[CharSet<Char>::MaxCompact];
                            int count = curr->head->firstSet->GetCompactEntries(CharSet<Char>::MaxCompact, entries);
                            Assert(count > 0);
                            for (int i = 0; i < count; i++)
                            {
                                if (allCanSkip)
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                                else
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                            }
                            item++;
                        }
                    }
                    break;
                }
            case Chain:
                {
                    //
                    // Compilation scheme:
                    //
                    //           JumpIfNot(Char|Set) L2
                    //           <item1>
                    //           Jump Lexit
                    //    L2:    JumpIfNot(Char|Set) L3
                    //           <item2>
                    //           Jump Lexit
                    //    L3:    <item3>                              (if non-optional)
                    //    L3:    JumpIfNot(Char|Set) Lexit            (if optional)
                    //           <item3>                              (if optional)
                    //    Lexit:
                    //
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                            numItems++;
                    }
                    Assert(numItems > 0);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastJumpFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (item > 0)
                                // Fixup previous Jump
                                compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());

                            CharCount itemSkipped = 0;
                            if (item < numItems-1 || isOptional)
                            {
                                if (curr->head->firstSet->IsSingleton())
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, curr->head->firstSet->Singleton())->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, curr->head->firstSet->Singleton())->targetLabel);
                                }
                                else
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                    {
                                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                    }
                                }
                            }
                            curr->head->Emit(compiler, itemSkipped);
                            if (item < numItems-1)
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            item++;
                        }
                    }
                    // Fixup jumps to exit
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    if (isOptional)
                        // Fixup last Jump to exit
                        compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());
                    break;
                }
            case Set:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Match(Char|Set)    (non optional)
                    //          OptMatch(Char|Set) (optional)
                    //
                    if (isOptional)
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, OptMatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    else
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, MatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, MatchSetInst<false>)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    break;
                }
        }
    }